

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O0

Var Js::JavascriptDate::EntryToLocaleDateString(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int n;
  CallFlags e;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptDate *pJVar9;
  JavascriptLibrary *pJVar10;
  EngineInterfaceObject *this;
  IntlEngineInterfaceExtensionObject *this_00;
  JavascriptString *pJVar11;
  DateTimeFlag local_ca;
  DateStringFormat local_c9;
  Arguments local_c8;
  undefined1 local_b8 [8];
  AutoReentrancyHandler autoReentrancyHandler_1;
  Arguments local_98;
  undefined1 local_88 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  JavascriptFunction *func;
  IntlEngineInterfaceExtensionObject *extensionObject;
  EngineInterfaceObject *nativeEngineInterfaceObj;
  JavascriptDate *date;
  Var result;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x528,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  result = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x52b,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) != 0) {
    pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
    bVar3 = VarIs<Js::JavascriptDate>(pvVar8);
    if (bVar3) {
      pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
      pJVar9 = VarTo<Js::JavascriptDate>(pvVar8);
      if (((DAT_01ea4150 & 1) != 0) &&
         (bVar3 = ScriptContext::IsIntlEnabled((ScriptContext *)result), bVar3)) {
        pJVar10 = ScriptContext::GetLibrary((ScriptContext *)result);
        this = JavascriptLibraryBase::GetEngineInterfaceObject
                         (&pJVar10->super_JavascriptLibraryBase);
        if (this != (EngineInterfaceObject *)0x0) {
          this_00 = (IntlEngineInterfaceExtensionObject *)
                    EngineInterfaceObject::GetEngineExtension
                              (this,EngineInterfaceExtensionKind_Intl);
          autoReentrancyHandler._8_8_ =
               IntlEngineInterfaceExtensionObject::GetDateToLocaleDateString(this_00);
          if ((JavascriptFunction *)autoReentrancyHandler._8_8_ != (JavascriptFunction *)0x0) {
            pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)result);
            AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_88,pTVar6);
            uVar2 = autoReentrancyHandler._8_8_;
            Arguments::Arguments(&local_98,(Arguments *)&scriptContext);
            callInfo_local =
                 (CallInfo)JavascriptFunction::CallFunction((JavascriptFunction *)uVar2,&local_98);
            AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_88);
            return (Var)callInfo_local;
          }
          pJVar10 = ScriptContext::GetLibrary((ScriptContext *)result);
          JavascriptLibrary::InitializeIntlForDatePrototype(pJVar10);
          autoReentrancyHandler._8_8_ =
               IntlEngineInterfaceExtensionObject::GetDateToLocaleDateString(this_00);
          if ((JavascriptFunction *)autoReentrancyHandler._8_8_ != (JavascriptFunction *)0x0) {
            pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)result);
            AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_b8,pTVar6);
            uVar2 = autoReentrancyHandler._8_8_;
            Arguments::Arguments(&local_c8,(Arguments *)&scriptContext);
            callInfo_local =
                 (CallInfo)JavascriptFunction::CallFunction((JavascriptFunction *)uVar2,&local_c8);
            AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_b8);
            return (Var)callInfo_local;
          }
          autoReentrancyHandler.m_savedReentrancySafeOrHandled = false;
          autoReentrancyHandler._9_7_ = 0;
        }
      }
      if (((ulong)scriptContext & 0xffffff) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                    ,0x558,"(args.Info.Count > 0)","Negative argument count");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      DateImplementation::DateStringFormat::DateStringFormat(&local_c9,Locale);
      pvVar8 = result;
      DateImplementation::DateTimeFlag::DateTimeFlag(&local_ca,NoTime);
      pJVar11 = DateImplementation::GetString
                          (&pJVar9->m_date,local_c9,(ScriptContext *)pvVar8,local_ca);
      return pJVar11;
    }
  }
  date = (JavascriptDate *)0x0;
  BVar4 = TryInvokeRemotely(EntryToLocaleDateString,(ScriptContext *)result,
                            (Arguments *)&scriptContext,&date);
  if (BVar4 != 0) {
    return date;
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)result,-0x7ff5ec3d,L"Date.prototype.toLocaleDateString");
}

Assistant:

Var JavascriptDate::EntryToLocaleDateString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<JavascriptDate>(args[0]))
        {
            Var result = nullptr;
            if (TryInvokeRemotely(EntryToLocaleDateString, scriptContext, args, &result))
            {
                return result;
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDate, _u("Date.prototype.toLocaleDateString"));
        }
        JavascriptDate* date = VarTo<JavascriptDate>(args[0]);

#ifdef ENABLE_INTL_OBJECT
        if (CONFIG_FLAG(IntlBuiltIns) && scriptContext->IsIntlEnabled()){

            EngineInterfaceObject* nativeEngineInterfaceObj = scriptContext->GetLibrary()->GetEngineInterfaceObject();
            if (nativeEngineInterfaceObj)
            {
                IntlEngineInterfaceExtensionObject* extensionObject = static_cast<IntlEngineInterfaceExtensionObject*>(nativeEngineInterfaceObj->GetEngineExtension(EngineInterfaceExtensionKind_Intl));
                JavascriptFunction* func = extensionObject->GetDateToLocaleDateString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }

                // Initialize Date.prototype.toLocaleDateString
                scriptContext->GetLibrary()->InitializeIntlForDatePrototype();
                func = extensionObject->GetDateToLocaleDateString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
        }
#endif

        AssertMsg(args.Info.Count > 0, "Negative argument count");
        return date->m_date.GetString(
            DateImplementation::DateStringFormat::Locale, scriptContext,
            DateImplementation::DateTimeFlag::NoTime);
    }